

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::CompressionParameters> *
kj::_::tryParseExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  char *pcVar1;
  undefined8 uVar2;
  ArrayPtr<const_char> *pAVar3;
  undefined8 uVar4;
  undefined1 uVar5;
  undefined8 uVar6;
  ArrayPtr<const_char> *pAVar7;
  long in_R8;
  ArrayPtr<const_char> *pAVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  bool local_c8;
  bool local_c7;
  undefined2 local_c6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c0;
  undefined1 local_b8 [16];
  ArrayPtr<const_char> *local_a8;
  ArrayDisposer *local_a0;
  undefined1 local_98 [16];
  ArrayPtr<const_char> *local_88;
  ArrayDisposer *local_80;
  Maybe<kj::CompressionParameters> local_60;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_98,(_ *)offers.content.ptr,input,(char)in_R8
            );
  uVar4 = local_98._8_8_;
  if (local_98._0_8_ == local_98._8_8_) {
    uVar5 = false;
  }
  else {
    uVar5 = (__return_storage_ptr__->ptr).isSet;
    local_c6 = *(undefined2 *)&(__return_storage_ptr__->ptr).field_1;
    local_c7 = (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet;
    local_c0 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10);
    local_c8 = (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet;
    uVar6 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
             ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20);
    pAVar8 = (ArrayPtr<const_char> *)local_98._0_8_;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar8->size_;
      splitParts((Vector<kj::ArrayPtr<const_char>_> *)local_b8,(_ *)pAVar8->ptr,input_00,(char)in_R8
                );
      iVar9 = 3;
      pAVar7 = (ArrayPtr<const_char> *)local_b8._0_8_;
      if (*(size_t *)(local_b8._0_8_ + 8) == 0x12) {
        pcVar1 = *(char **)local_b8._0_8_;
        auVar10[0] = -(*pcVar1 == 'p');
        auVar10[1] = -(pcVar1[1] == 'e');
        auVar10[2] = -(pcVar1[2] == 'r');
        auVar10[3] = -(pcVar1[3] == 'm');
        auVar10[4] = -(pcVar1[4] == 'e');
        auVar10[5] = -(pcVar1[5] == 's');
        auVar10[6] = -(pcVar1[6] == 's');
        auVar10[7] = -(pcVar1[7] == 'a');
        auVar10[8] = -(pcVar1[8] == 'g');
        auVar10[9] = -(pcVar1[9] == 'e');
        auVar10[10] = -(pcVar1[10] == '-');
        auVar10[0xb] = -(pcVar1[0xb] == 'd');
        auVar10[0xc] = -(pcVar1[0xc] == 'e');
        auVar10[0xd] = -(pcVar1[0xd] == 'f');
        auVar10[0xe] = -(pcVar1[0xe] == 'l');
        auVar10[0xf] = -(pcVar1[0xf] == 'a');
        auVar11[0] = -((char)*(undefined2 *)(pcVar1 + 0x10) == 't');
        auVar11[1] = -((char)((ushort)*(undefined2 *)(pcVar1 + 0x10) >> 8) == 'e');
        auVar11[2] = 0xff;
        auVar11[3] = 0xff;
        auVar11[4] = 0xff;
        auVar11[5] = 0xff;
        auVar11[6] = 0xff;
        auVar11[7] = 0xff;
        auVar11[8] = 0xff;
        auVar11[9] = 0xff;
        auVar11[10] = 0xff;
        auVar11[0xb] = 0xff;
        auVar11[0xc] = 0xff;
        auVar11[0xd] = 0xff;
        auVar11[0xe] = 0xff;
        auVar11[0xf] = 0xff;
        auVar11 = auVar11 & auVar10;
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0038f00e;
        tryExtractParameters(&local_60,(Vector<kj::ArrayPtr<const_char>_> *)local_b8,false);
        if (local_60.ptr.isSet == true) {
          local_c7 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
          local_c6 = local_60.ptr.field_1._0_2_;
          if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet != false) {
            local_c0 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
          }
          local_c8 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
          if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet != false) {
            uVar6 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
          }
          iVar9 = 1;
          uVar5 = 1;
        }
        else {
          iVar9 = 0;
        }
        pAVar7 = (ArrayPtr<const_char> *)local_b8._0_8_;
        if ((ArrayPtr<const_char> *)local_b8._0_8_ != (ArrayPtr<const_char> *)0x0)
        goto LAB_0038f00e;
      }
      else {
LAB_0038f00e:
        pAVar3 = local_a8;
        uVar2 = local_b8._8_8_;
        local_b8 = (undefined1  [16])0x0;
        local_a8 = (ArrayPtr<const_char> *)0x0;
        in_R8 = (long)pAVar3 - (long)pAVar7 >> 4;
        (**local_a0->_vptr_ArrayDisposer)(local_a0,pAVar7,0x10,uVar2 - (long)pAVar7 >> 4,in_R8,0);
      }
      if ((iVar9 != 3) && (iVar9 != 0)) goto LAB_0038f079;
      pAVar8 = pAVar8 + 1;
    } while (pAVar8 != (ArrayPtr<const_char> *)uVar4);
    uVar5 = 0;
LAB_0038f079:
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = local_c6;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = local_c7;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_c0;
    (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = local_c8;
    *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uVar6;
  }
  pAVar8 = local_88;
  (__return_storage_ptr__->ptr).isSet = (bool)uVar5;
  uVar4 = local_98._0_8_;
  if ((ArrayPtr<const_char> *)local_98._0_8_ != (ArrayPtr<const_char> *)0x0) {
    uVar6 = local_98._8_8_;
    local_98 = (undefined1  [16])0x0;
    local_88 = (ArrayPtr<const_char> *)0x0;
    (**local_80->_vptr_ArrayDisposer)
              (local_80,uVar4,0x10,(long)(uVar6 - uVar4) >> 4,(long)pAVar8 - uVar4 >> 4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseExtensionOffers(StringPtr offers) {
  // Given a string of offers, accept the first valid offer by returning a `CompressionParameters`
  // struct. If there are no valid offers, return `kj::none`.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      return kj::mv(config);
    }
  }
  return kj::none;
}